

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O1

int fill_cmd_string(nt_opts *opts,int argc,char **argv)

{
  char *__s;
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  ushort **ppuVar5;
  ulong uVar6;
  char *__format;
  char *__s_00;
  ulong uVar7;
  int iVar8;
  char *__s_01;
  int local_48;
  
  __s_00 = opts->command;
  iVar1 = sprintf(__s_00,"\n  command: %s",*argv);
  __s_01 = opts->command + iVar1;
  if (1 < argc) {
    iVar1 = 0x800 - iVar1;
    uVar7 = 1;
    iVar8 = 0;
    do {
      if (iVar8 == 0) {
        __s = argv[uVar7];
        sVar4 = strlen(__s);
        iVar8 = (int)sVar4;
        if (iVar1 <= iVar8 + 3) {
          fill_cmd_string_cold_1();
          return 1;
        }
        __format = " %s";
        if (1 < iVar8) {
          ppuVar5 = __ctype_b_loc();
          uVar6 = 0;
          do {
            if ((*(byte *)((long)*ppuVar5 + (long)__s[uVar6] * 2 + 1) & 0x20) != 0) {
              __format = " \'%s\'";
              goto LAB_0010bf91;
            }
            uVar6 = uVar6 + 1;
          } while (iVar8 - 1 != uVar6);
          __format = " %s";
        }
LAB_0010bf91:
        iVar8 = 0;
        iVar2 = sprintf(__s_01,__format,__s);
        iVar3 = strncmp(argv[uVar7 - 1],"-infiles",3);
        if ((iVar3 == 0) && (iVar3 = (opts->infiles).len, iVar8 = iVar3 + -2, iVar3 < 5)) {
          iVar8 = 0;
        }
        iVar1 = iVar1 - iVar2;
        __s_01 = __s_01 + iVar2;
      }
      else {
        iVar8 = iVar8 + -1;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uint)argc);
  }
  if (1 < g_debug) {
    local_48 = (int)__s_00;
    fprintf(_stderr,"+d filled command string, %d args, %d bytes\n",(ulong)(uint)argc,
            (ulong)(uint)((int)__s_01 - local_48));
    if (2 < g_debug) {
      fprintf(_stderr,"%s\n",__s_00);
    }
  }
  return 0;
}

Assistant:

int fill_cmd_string( nt_opts * opts, int argc, char * argv[])
{
   char * cp;
   int    len, remain = NT_CMD_LEN;  /* NT_CMD_LEN is max command len */
   int    c, ac;
   int    has_space;  /* arguments containing space must be quoted */
   int    skip = 0;   /* counter to skip some of the arguments     */

   /* get the first argument separately */
   len = sprintf( opts->command, "\n  command: %s", argv[0] );
   cp = opts->command + len;
   remain -= len;

   /* get the rest, with special attention to input files */
   for( ac = 1; ac < argc; ac++ )
   {
      if( skip ){ skip--;  continue; }  /* then skip these arguments */

      len = strlen(argv[ac]);
      if( len + 3 >= remain ) {  /* extra 3 for space and possible '' */
         fprintf(stderr,"FCS: no space remaining for command, continuing...\n");
         return 1;
      }

      /* put the argument in, possibly with '' */

      has_space = 0;
      for( c = 0; c < len-1; c++ )
         if( isspace(argv[ac][c]) ){ has_space = 1; break; }
      if( has_space ) len = sprintf(cp, " '%s'", argv[ac]);
      else            len = sprintf(cp, " %s",   argv[ac]);

      remain -= len;

      /* infiles is okay, but after the *next* argument, we may skip files */
      /* (danger, will robinson!  hack alert!) */
      if( !strncmp(argv[ac-1],"-infiles",3) )
      {
         /* if more than 4 (just to be arbitrary) input files,
            include only the first and last */
         if( opts->infiles.len > 4 )
            skip = opts->infiles.len - 2;
      }

      cp += len;
   }

   if( g_debug > 1 ){
      fprintf(stderr,"+d filled command string, %d args, %d bytes\n",
              argc, (int)(cp - opts->command));
      if( g_debug > 2 ) fprintf(stderr,"%s\n", opts->command);
   }

   return 0;
}